

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O1

void png_build_8bit_table(png_structrp png_ptr,png_bytepp ptable,png_fixed_point gamma_val)

{
  int iVar1;
  png_byte *ppVar2;
  long lVar3;
  double dVar4;
  
  ppVar2 = (png_byte *)png_malloc(png_ptr,0x100);
  *ptable = ppVar2;
  if (gamma_val - 95000U < 0x2711) {
    lVar3 = 0;
    do {
      ppVar2[lVar3] = (png_byte)lVar3;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x100);
  }
  else {
    lVar3 = 0;
    do {
      iVar1 = (int)lVar3;
      if (iVar1 - 1U < 0xfe) {
        dVar4 = pow((double)iVar1 / 255.0,(double)gamma_val * 1e-05);
        dVar4 = floor(dVar4 * 255.0 + 0.5);
        iVar1 = (int)dVar4;
      }
      ppVar2[lVar3] = (png_byte)iVar1;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x100);
  }
  return;
}

Assistant:

static void
png_build_8bit_table(png_structrp png_ptr, png_bytepp ptable,
    png_fixed_point gamma_val)
{
   unsigned int i;
   png_bytep table = *ptable = (png_bytep)png_malloc(png_ptr, 256);

   if (png_gamma_significant(gamma_val) != 0)
      for (i=0; i<256; i++)
         table[i] = png_gamma_8bit_correct(i, gamma_val);

   else
      for (i=0; i<256; ++i)
         table[i] = (png_byte)(i & 0xff);
}